

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::parse(App *this,string *commandline,bool program_name_included)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  size_type sVar7;
  void *pvVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  bool bVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  nstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  App *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  long *local_110;
  size_type local_108;
  long local_100 [2];
  long *local_f0;
  size_type local_e8;
  long local_e0 [2];
  string local_d0;
  string local_b0 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  if ((int)CONCAT71(in_register_00000011,program_name_included) == 0) {
    local_190._M_dataplus._M_p = (commandline->_M_dataplus)._M_p;
    local_70.first._M_dataplus._M_p = local_190._M_dataplus._M_p + commandline->_M_string_length;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (&local_128);
    commandline->_M_string_length =
         (long)local_128.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - (long)(commandline->_M_dataplus)._M_p;
    *(undefined1 *)
     &((local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = 0;
    _Var6 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                      ();
    pcVar4 = (commandline->_M_dataplus)._M_p;
    if (pcVar4 + commandline->_M_string_length == _Var6._M_current) {
      commandline->_M_string_length = 0;
      *pcVar4 = '\0';
    }
    else {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,0,
                 (long)_Var6._M_current - (long)pcVar4);
    }
  }
  else {
    pcVar4 = (commandline->_M_dataplus)._M_p;
    local_b0[0]._M_dataplus._M_p = (pointer)&local_b0[0].field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar4,pcVar4 + commandline->_M_string_length);
    detail::split_program_name(&local_70,local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0[0]._M_dataplus._M_p != &local_b0[0].field_2) {
      operator_delete(local_b0[0]._M_dataplus._M_p,local_b0[0].field_2._M_allocated_capacity + 1);
    }
    if (((this->name_)._M_string_length == 0) || (this->has_automatic_name_ == true)) {
      this->has_automatic_name_ = true;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->name_,
                 &local_70.first);
    }
    parse();
  }
  if (commandline->_M_string_length != 0) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    pcVar4 = (commandline->_M_dataplus)._M_p;
    local_130 = this;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar4,pcVar4 + commandline->_M_string_length);
    local_110 = local_100;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"=","");
    sVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&local_150,(char *)local_110,0,local_108);
    if (sVar7 != 0xffffffffffffffff) {
      do {
        _Var5._M_p = local_150._M_dataplus._M_p;
        if ((((byte)local_150._M_dataplus._M_p[sVar7 + 1] - 0x22 < 0x3f) &&
            ((0x4000000000000021U >>
              ((ulong)((byte)local_150._M_dataplus._M_p[sVar7 + 1] - 0x22) & 0x3f) & 1) != 0)) &&
           (local_150._M_string_length != 0)) {
          uVar9 = local_150._M_string_length - 1;
          if (sVar7 - 1 <= local_150._M_string_length - 1) {
            uVar9 = sVar7 - 1;
          }
          do {
            cVar3 = _Var5._M_p[uVar9];
            pvVar8 = memchr("-/ \"\'`",(int)cVar3,6);
            if (pvVar8 != (void *)0x0) {
              if ((uint)(_Var5._M_p[sVar7] != '=') * 2 + 0x2d == (int)cVar3) {
                _Var5._M_p[sVar7] = ' ';
              }
              break;
            }
            bVar10 = uVar9 != 0;
            uVar9 = uVar9 - 1;
          } while (bVar10);
        }
        sVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&local_150,(char *)local_110,sVar7 + 1,local_108);
      } while (sVar7 != 0xffffffffffffffff);
    }
    this = local_130;
    paVar2 = &local_150.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == paVar2) {
      local_190.field_2._8_8_ = local_150.field_2._8_8_;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190._M_dataplus._M_p = local_150._M_dataplus._M_p;
    }
    local_190.field_2._M_allocated_capacity._1_7_ = local_150.field_2._M_allocated_capacity._1_7_;
    local_190.field_2._M_local_buf[0] = local_150.field_2._M_local_buf[0];
    local_190._M_string_length = local_150._M_string_length;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,
               &local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
    if (this->allow_windows_style_options_ == true) {
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      pcVar4 = (commandline->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar4,pcVar4 + commandline->_M_string_length);
      local_f0 = local_e0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,":","");
      sVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(&local_170,(char *)local_f0,0,local_e8);
      if (sVar7 != 0xffffffffffffffff) {
        do {
          _Var5._M_p = local_170._M_dataplus._M_p;
          if ((((byte)local_170._M_dataplus._M_p[sVar7 + 1] - 0x22 < 0x3f) &&
              ((0x4000000000000021U >>
                ((ulong)((byte)local_170._M_dataplus._M_p[sVar7 + 1] - 0x22) & 0x3f) & 1) != 0)) &&
             (local_170._M_string_length != 0)) {
            uVar9 = local_170._M_string_length - 1;
            if (sVar7 - 1 <= local_170._M_string_length - 1) {
              uVar9 = sVar7 - 1;
            }
            do {
              cVar3 = _Var5._M_p[uVar9];
              pvVar8 = memchr("-/ \"\'`",(int)cVar3,6);
              if (pvVar8 != (void *)0x0) {
                if ((uint)(_Var5._M_p[sVar7] != '=') * 2 + 0x2d == (int)cVar3) {
                  _Var5._M_p[sVar7] = ' ';
                }
                break;
              }
              bVar10 = uVar9 != 0;
              uVar9 = uVar9 - 1;
            } while (bVar10);
          }
          sVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::find(&local_170,(char *)local_f0,sVar7 + 1,local_e8);
        } while (sVar7 != 0xffffffffffffffff);
      }
      paVar2 = &local_170.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p == paVar2) {
        local_190.field_2._8_8_ = local_170.field_2._8_8_;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190._M_dataplus._M_p = local_170._M_dataplus._M_p;
      }
      local_190.field_2._M_allocated_capacity._1_7_ = local_170.field_2._M_allocated_capacity._1_7_;
      local_190.field_2._M_local_buf[0] = local_170.field_2._M_local_buf[0];
      local_190._M_string_length = local_170._M_string_length;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      local_170._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,
                 &local_190);
      this = local_130;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar2) {
        operator_delete(local_170._M_dataplus._M_p,
                        CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                 local_170.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  local_d0._M_dataplus._M_p = (commandline->_M_dataplus)._M_p;
  paVar1 = &commandline->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar1) {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&commandline->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_d0._M_string_length = commandline->_M_string_length;
  (commandline->_M_dataplus)._M_p = (pointer)paVar1;
  commandline->_M_string_length = 0;
  (commandline->field_2)._M_local_buf[0] = '\0';
  detail::split_up(&local_128,&local_d0,'\0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_190._M_string_length = 0;
  local_190.field_2._M_allocated_capacity =
       local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  __first = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_128.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_128.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_128,(iterator)__first._M_current,
             (iterator)
             local_128.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  detail::remove_quotes(&local_128);
  __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (local_128.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1);
  if (local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < __s &&
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_128.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,__s);
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_128.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      __s = __s + -1;
    } while (local_128.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start < __s);
  }
  if (this->parsed_ != 0) {
    clear(this);
  }
  this->parsed_ = 1;
  _validate(this);
  _configure(this);
  this->parent_ = (App *)0x0;
  this->parsed_ = 0;
  _parse(this,&local_128);
  run_callback(this,false,false);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return;
}

Assistant:

CLI11_INLINE void App::parse(std::string commandline, bool program_name_included) {

    if(program_name_included) {
        auto nstr = detail::split_program_name(commandline);
        if((name_.empty()) || (has_automatic_name_)) {
            has_automatic_name_ = true;
            name_ = nstr.first;
        }
        commandline = std::move(nstr.second);
    } else {
        detail::trim(commandline);
    }
    // the next section of code is to deal with quoted arguments after an '=' or ':' for windows like operations
    if(!commandline.empty()) {
        commandline = detail::find_and_modify(commandline, "=", detail::escape_detect);
        if(allow_windows_style_options_)
            commandline = detail::find_and_modify(commandline, ":", detail::escape_detect);
    }

    auto args = detail::split_up(std::move(commandline));
    // remove all empty strings
    args.erase(std::remove(args.begin(), args.end(), std::string{}), args.end());
    try {
        detail::remove_quotes(args);
    } catch(const std::invalid_argument &arg) {
        throw CLI::ParseError(arg.what(), CLI::ExitCodes::InvalidError);
    }
    std::reverse(args.begin(), args.end());
    parse(std::move(args));
}